

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

void do_commands(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  int col;
  int cmd;
  char buf [4608];
  undefined4 in_stack_ffffffffffffedd8;
  int local_1220;
  int local_121c;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  
  local_1220 = 0;
  local_121c = 0;
  while (*cmd_table[local_121c].name != '\0') {
    if (cmd_table[local_121c].level < 0x33) {
      iVar1 = (int)cmd_table[local_121c].level;
      iVar2 = get_trust((CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffedd8));
      if ((iVar1 <= iVar2) && (cmd_table[local_121c].show != 0)) {
        sprintf(&stack0xffffffffffffede8,"%-12s",cmd_table[local_121c].name);
        send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
        local_1220 = local_1220 + 1;
        if (local_1220 % 6 == 0) {
          send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
        }
      }
    }
    local_121c = local_121c + 1;
  }
  if (local_1220 % 6 != 0) {
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  }
  return;
}

Assistant:

void do_commands(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int cmd;
	int col;

	col = 0;

	for (cmd = 0; cmd_table[cmd].name[0] != '\0'; cmd++)
	{
		if (cmd_table[cmd].level < LEVEL_HERO && cmd_table[cmd].level <= get_trust(ch) && cmd_table[cmd].show)
		{
			sprintf(buf, "%-12s", cmd_table[cmd].name);
			send_to_char(buf, ch);

			if (++col % 6 == 0)
				send_to_char("\n\r", ch);
		}
	}

	if (col % 6 != 0)
		send_to_char("\n\r", ch);
}